

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.h
# Opt level: O2

void __thiscall box::box(box *this,vec3 *p0,vec3 *p1,shared_ptr<material> *ptr)

{
  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> *this_00;
  double dVar1;
  element_type *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  shared_ptr<material> *local_c8;
  shared_ptr<material> local_c0;
  double local_b0;
  double local_a8;
  double local_a0;
  value_type local_98;
  value_type local_88;
  value_type local_78;
  value_type local_68;
  value_type local_58;
  value_type local_48;
  
  (this->super_hittable)._vptr_hittable = (_func_int **)&PTR_hit_0012c068;
  (this->box_max).e[1] = 0.0;
  (this->box_max).e[2] = 0.0;
  (this->box_min).e[2] = 0.0;
  (this->box_max).e[0] = 0.0;
  (this->box_min).e[0] = 0.0;
  (this->box_min).e[1] = 0.0;
  (this->sides).super_hittable._vptr_hittable = (_func_int **)&PTR_hit_0012c0f8;
  (this->sides).objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sides).objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sides).objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  dVar1 = p0->e[1];
  (this->box_min).e[0] = p0->e[0];
  (this->box_min).e[1] = dVar1;
  (this->box_min).e[2] = p0->e[2];
  dVar1 = p1->e[1];
  (this->box_max).e[0] = p1->e[0];
  (this->box_max).e[1] = dVar1;
  (this->box_max).e[2] = p1->e[2];
  local_a0 = p0->e[0];
  local_a8 = p1->e[0];
  local_b0 = p0->e[1];
  local_c0.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p1->e[1];
  local_c0.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)p1->e[2];
  local_c8 = ptr;
  std::make_shared<xy_rect,double,double,double,double,double,std::shared_ptr<material>&>
            ((double *)&local_d8,&local_a0,&local_a8,&local_b0,
             (double *)
             &local_c0.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_c0);
  this_00 = &(this->sides).objects;
  local_48.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d8;
  local_48.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_d0._M_pi;
  local_d8 = (element_type *)0x0;
  _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this_00,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_d0);
  local_a0 = p0->e[0];
  local_a8 = p1->e[0];
  local_b0 = p0->e[1];
  local_c0.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p1->e[1];
  local_c0.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)p0->e[2];
  std::make_shared<xy_rect,double,double,double,double,double,std::shared_ptr<material>&>
            ((double *)&local_d8,&local_a0,&local_a8,&local_b0,
             (double *)
             &local_c0.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_c0);
  local_58.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d8;
  local_58.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_d0._M_pi;
  local_d8 = (element_type *)0x0;
  _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this_00,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_d0);
  local_a0 = p0->e[0];
  local_a8 = p1->e[0];
  local_b0 = p0->e[2];
  local_c0.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p1->e[2];
  local_c0.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)p1->e[1];
  std::make_shared<xz_rect,double,double,double,double,double,std::shared_ptr<material>&>
            ((double *)&local_d8,&local_a0,&local_a8,&local_b0,
             (double *)
             &local_c0.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_c0);
  local_68.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d8;
  local_68.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_d0._M_pi;
  local_d8 = (element_type *)0x0;
  _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this_00,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_d0);
  local_a0 = p0->e[0];
  local_a8 = p1->e[0];
  local_b0 = p0->e[2];
  local_c0.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p1->e[2];
  local_c0.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)p0->e[1];
  std::make_shared<xz_rect,double,double,double,double,double,std::shared_ptr<material>&>
            ((double *)&local_d8,&local_a0,&local_a8,&local_b0,
             (double *)
             &local_c0.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_c0);
  local_78.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d8;
  local_78.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_d0._M_pi;
  local_d8 = (element_type *)0x0;
  _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this_00,&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_d0);
  local_a0 = p0->e[1];
  local_a8 = p1->e[1];
  local_b0 = p0->e[2];
  local_c0.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p1->e[2];
  local_c0.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)p1->e[0];
  std::make_shared<yz_rect,double,double,double,double,double,std::shared_ptr<material>&>
            ((double *)&local_d8,&local_a0,&local_a8,&local_b0,
             (double *)
             &local_c0.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_c0);
  local_88.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d8;
  local_88.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_d0._M_pi;
  local_d8 = (element_type *)0x0;
  _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this_00,&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_d0);
  local_a0 = p0->e[1];
  local_a8 = p1->e[1];
  local_b0 = p0->e[2];
  local_c0.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p1->e[2];
  local_c0.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)p0->e[0];
  std::make_shared<yz_rect,double,double,double,double,double,std::shared_ptr<material>&>
            ((double *)&local_d8,&local_a0,&local_a8,&local_b0,
             (double *)
             &local_c0.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_c0);
  local_98.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d8;
  local_98.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_d0._M_pi;
  local_d8 = (element_type *)0x0;
  _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this_00,&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_d0);
  return;
}

Assistant:

box::box(const vec3& p0, const vec3& p1, shared_ptr<material> ptr) {
    box_min = p0;
    box_max = p1;

    sides.add(make_shared<xy_rect>(p0.x(), p1.x(), p0.y(), p1.y(), p1.z(), ptr));
    sides.add(make_shared<xy_rect>(p0.x(), p1.x(), p0.y(), p1.y(), p0.z(), ptr));

    sides.add(make_shared<xz_rect>(p0.x(), p1.x(), p0.z(), p1.z(), p1.y(), ptr));
    sides.add(make_shared<xz_rect>(p0.x(), p1.x(), p0.z(), p1.z(), p0.y(), ptr));

    sides.add(make_shared<yz_rect>(p0.y(), p1.y(), p0.z(), p1.z(), p1.x(), ptr));
    sides.add(make_shared<yz_rect>(p0.y(), p1.y(), p0.z(), p1.z(), p0.x(), ptr));
}